

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

void uv__io_poll(uv_loop_t *loop,int timeout)

{
  long *plVar1;
  uv__iou *ctl;
  int __epfd;
  int __fd;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint64_t uVar5;
  uv__queue *puVar6;
  uv__queue *puVar7;
  long lVar8;
  uv_fs_t *req;
  uv__statx *statxbuf;
  uv__io_s *puVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  int *piVar15;
  uint64_t uVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  epoll_event *__event;
  uint uVar22;
  bool bVar23;
  uint local_3d50;
  int local_3d3c;
  uint local_3d20;
  int local_3d1c;
  int local_3d10;
  __sigset_t *local_3d08;
  epoll_event e;
  uv__invalidate inv;
  sigset_t sigset;
  epoll_event prep [256];
  epoll_event events [1024];
  
  puVar4 = (uint *)loop->internal_fields;
  if ((loop->flags & 1) == 0) {
    local_3d08 = (__sigset_t *)0x0;
  }
  else {
    local_3d08 = (__sigset_t *)&sigset;
    sigemptyset(local_3d08);
    sigaddset(local_3d08,0x1b);
  }
  if (timeout < -1) {
    __assert_fail("timeout >= -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                  ,0x52f,"void uv__io_poll(uv_loop_t *, int)");
  }
  uVar5 = loop->time;
  uVar18 = -(*puVar4 & 1) & timeout;
  bVar23 = (*puVar4 & 1) == 0;
  local_3d50 = 0;
  if (bVar23) {
    local_3d50 = timeout;
  }
  __epfd = loop->backend_fd;
  e.data.u64._4_4_ = 0;
  e._0_8_ = 0;
  ctl = (uv__iou *)(puVar4 + 0x32);
  while (puVar6 = (loop->watcher_queue).next, puVar6 != &loop->watcher_queue) {
    puVar7 = puVar6->next;
    puVar6->prev->next = puVar7;
    puVar7->prev = puVar6->prev;
    puVar6->next = puVar6;
    puVar6->prev = puVar6;
    e.events = *(uint32_t *)&puVar6[1].next;
    iVar13 = *(int *)((long)&puVar6[1].next + 4);
    iVar19 = (iVar13 != 0) + 1 + (uint)(iVar13 != 0);
    *(uint32_t *)((long)&puVar6[1].next + 4) = e.events;
    __fd = *(int *)&puVar6[1].prev;
    e.data.fd = __fd;
    if (puVar4[0x50] == 0xffffffff) {
      iVar19 = epoll_ctl(__epfd,iVar19,__fd,(epoll_event *)&e);
      if (iVar19 != 0) {
        if (iVar13 != 0) {
          __assert_fail("op == EPOLL_CTL_ADD",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                        ,0x558,"void uv__io_poll(uv_loop_t *, int)");
        }
        piVar15 = __errno_location();
        if (*piVar15 != 0x11) {
          __assert_fail("errno == EEXIST",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                        ,0x559,"void uv__io_poll(uv_loop_t *, int)");
        }
        iVar13 = epoll_ctl(__epfd,3,__fd,(epoll_event *)&e);
        if (iVar13 != 0) {
          abort();
        }
      }
    }
    else {
      uv__epoll_ctl_prep(__epfd,ctl,&prep,iVar19,__fd,&e);
    }
  }
  inv.events = events;
  inv.prep = &prep;
  inv.nfds = -1;
  local_3d10 = 0x30;
  local_3d20 = timeout;
  do {
    while( true ) {
      if ((loop->nfds == 0) && (puVar4[0x73] == 0)) goto LAB_0011b410;
      if (puVar4[0x50] != 0xffffffff) {
        while (**(int **)(puVar4 + 0x32) != **(int **)(puVar4 + 0x34)) {
          uv__epoll_ctl_flush(__epfd,ctl,&prep);
        }
      }
      if (local_3d50 != 0) {
        uv__metrics_set_provider_entry_time(loop);
      }
      puVar4[0x30] = local_3d50;
      uVar14 = epoll_pwait(__epfd,(epoll_event *)events,0x400,local_3d50,local_3d08);
      piVar15 = __errno_location();
      iVar13 = *piVar15;
      uVar16 = uv__hrtime(UV_CLOCK_FAST);
      loop->time = uVar16 / 1000000;
      *piVar15 = iVar13;
      if (uVar14 != 0xffffffff) break;
      if (iVar13 != 4) {
        __assert_fail("errno == EINTR",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                      ,0x585,"void uv__io_poll(uv_loop_t *, int)");
      }
      if (!bVar23) {
        local_3d50 = uVar18;
      }
LAB_0011b3ca:
      bVar23 = true;
      if (local_3d50 != 0xffffffff) {
        if (local_3d50 == 0) goto LAB_0011b410;
        if ((int)local_3d50 < 1) {
          __assert_fail("timeout > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                        ,0x60b,"void uv__io_poll(uv_loop_t *, int)");
        }
        local_3d20 = local_3d20 + ((int)uVar5 - (int)loop->time);
        bVar23 = true;
        local_3d50 = local_3d20;
        if ((int)local_3d20 < 1) goto LAB_0011b410;
      }
    }
    if (local_3d50 == 0xffffffff && uVar14 == 0) {
      __assert_fail("timeout != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                    ,0x588,"void uv__io_poll(uv_loop_t *, int)");
    }
    if (uVar14 == 0) {
      local_3d50 = uVar18;
      if (bVar23) {
        return;
      }
      goto LAB_0011b3ca;
    }
    uVar20 = 0;
    uVar21 = 0;
    if (0 < (int)uVar14) {
      uVar21 = (ulong)uVar14;
    }
    *(uv__invalidate **)(puVar4 + 0x76) = &inv;
    bVar12 = 0;
    bVar10 = false;
    local_3d3c = 0;
    inv.nfds = uVar14;
    for (; uVar20 != uVar21; uVar20 = uVar20 + 1) {
      uVar22 = events[uVar20].data.fd;
      if ((ulong)uVar22 != 0xffffffff) {
        if (uVar22 == puVar4[0x72]) {
          uVar22 = **(uint **)(puVar4 + 0x5e);
          uVar2 = **(uint **)(puVar4 + 0x60);
          uVar3 = puVar4[0x62];
          lVar8 = *(long *)(puVar4 + 0x66);
          local_3d1c = 0;
          for (; uVar2 != uVar22; uVar22 = uVar22 + 1) {
            lVar17 = (ulong)(uVar22 & uVar3) * 0x10;
            req = *(uv_fs_t **)(lVar8 + lVar17);
            if (req->type != UV_FS) {
              __assert_fail("req->type == UV_FS",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                            ,0x467,"void uv__poll_io_uring(uv_loop_t *, struct uv__iou *)");
            }
            if ((loop->active_reqs).count == 0) {
              __assert_fail("uv__has_active_reqs(loop)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                            ,0x469,"void uv__poll_io_uring(uv_loop_t *, struct uv__iou *)");
            }
            (loop->active_reqs).count = (loop->active_reqs).count - 1;
            puVar4[0x73] = puVar4[0x73] - 1;
            iVar13 = *(int *)(lVar17 + lVar8 + 8);
            if ((long)iVar13 == -0x5f) {
              uv__fs_post(loop,req);
            }
            else {
              req->result = (long)iVar13;
              if ((uint)(req->fs_type + ~UV_FS_SENDFILE) < 3) {
                statxbuf = (uv__statx *)req->ptr;
                req->ptr = (void *)0x0;
                if (iVar13 == 0) {
                  uv__statx_to_stat(statxbuf,&req->statbuf);
                  req->ptr = &req->statbuf;
                }
                uv__free(statxbuf);
              }
              uv__metrics_update_idle_time(loop);
              (*req->cb)(req);
              local_3d1c = local_3d1c + 1;
            }
          }
          **(uint **)(puVar4 + 0x5e) = uVar2;
          if ((**(uint **)(puVar4 + 0x5c) & 2) != 0) {
            do {
              iVar13 = uv__io_uring_enter(puVar4[0x72],0,0,1);
              if (iVar13 != -1) {
                if (-1 < iVar13) goto LAB_0011b2a3;
                break;
              }
            } while (*piVar15 == 4);
            perror("libuv: io_uring_enter(getevents)");
          }
LAB_0011b2a3:
          plVar1 = (long *)((long)loop->internal_fields + 0x10);
          *plVar1 = *plVar1 + (long)local_3d1c;
          if (*(int *)((long)loop->internal_fields + 0xc0) == 0) {
            plVar1 = (long *)((long)loop->internal_fields + 0x18);
            *plVar1 = *plVar1 + (long)local_3d1c;
          }
          bVar12 = 1;
        }
        else {
          if ((int)uVar22 < 0) {
            __assert_fail("fd >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                          ,0x5ab,"void uv__io_poll(uv_loop_t *, int)");
          }
          if (loop->nwatchers <= uVar22) {
            __assert_fail("(unsigned) fd < loop->nwatchers",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                          ,0x5ac,"void uv__io_poll(uv_loop_t *, int)");
          }
          __event = (epoll_event *)(events + uVar20);
          puVar9 = loop->watchers[uVar22];
          if (puVar9 == (uv__io_s *)0x0) {
            epoll_ctl(__epfd,2,uVar22,__event);
          }
          else {
            uVar22 = (puVar9->pevents | 0x18) & __event->events;
            __event->events = uVar22;
            if (uVar22 != 0) {
              if ((uVar22 == 0x10) || (uVar22 == 8)) {
                __event->events = puVar9->pevents & 0x2007 | uVar22;
              }
              bVar11 = true;
              if (puVar9 != &loop->signal_io_watcher) {
                uv__metrics_update_idle_time(loop);
                (*puVar9->cb)(loop,puVar9,__event->events);
                bVar11 = bVar10;
              }
              local_3d3c = local_3d3c + 1;
              bVar10 = bVar11;
            }
          }
        }
      }
    }
    plVar1 = (long *)((long)loop->internal_fields + 0x10);
    *plVar1 = *plVar1 + (long)local_3d3c;
    if (!bVar23) {
      plVar1 = (long *)((long)loop->internal_fields + 0x18);
      *plVar1 = *plVar1 + (long)local_3d3c;
      local_3d50 = uVar18;
    }
    if (bVar10) {
      uv__metrics_update_idle_time(loop);
      (*(loop->signal_io_watcher).cb)(loop,&loop->signal_io_watcher,1);
    }
    puVar4[0x76] = 0;
    puVar4[0x77] = 0;
    if ((bool)(bVar10 | bVar12)) break;
    if (local_3d3c == 0) goto LAB_0011b3ca;
    if (uVar14 != 0x400) break;
    bVar23 = true;
    local_3d10 = local_3d10 + -1;
    local_3d50 = 0;
  } while (local_3d10 != 0);
LAB_0011b410:
  if (puVar4[0x50] != 0xffffffff) {
    while (**(int **)(puVar4 + 0x32) != **(int **)(puVar4 + 0x34)) {
      uv__epoll_ctl_flush(__epfd,ctl,&prep);
    }
  }
  return;
}

Assistant:

void uv__io_poll(uv_loop_t* loop, int timeout) {
  uv__loop_internal_fields_t* lfields;
  struct epoll_event events[1024];
  struct epoll_event prep[256];
  struct uv__invalidate inv;
  struct epoll_event* pe;
  struct epoll_event e;
  struct uv__iou* ctl;
  struct uv__iou* iou;
  int real_timeout;
  struct uv__queue* q;
  uv__io_t* w;
  sigset_t* sigmask;
  sigset_t sigset;
  uint64_t base;
  int have_iou_events;
  int have_signals;
  int nevents;
  int epollfd;
  int count;
  int nfds;
  int fd;
  int op;
  int i;
  int user_timeout;
  int reset_timeout;

  lfields = uv__get_internal_fields(loop);
  ctl = &lfields->ctl;
  iou = &lfields->iou;

  sigmask = NULL;
  if (loop->flags & UV_LOOP_BLOCK_SIGPROF) {
    sigemptyset(&sigset);
    sigaddset(&sigset, SIGPROF);
    sigmask = &sigset;
  }

  assert(timeout >= -1);
  base = loop->time;
  count = 48; /* Benchmarks suggest this gives the best throughput. */
  real_timeout = timeout;

  if (lfields->flags & UV_METRICS_IDLE_TIME) {
    reset_timeout = 1;
    user_timeout = timeout;
    timeout = 0;
  } else {
    reset_timeout = 0;
    user_timeout = 0;
  }

  epollfd = loop->backend_fd;

  memset(&e, 0, sizeof(e));

  while (!uv__queue_empty(&loop->watcher_queue)) {
    q = uv__queue_head(&loop->watcher_queue);
    w = uv__queue_data(q, uv__io_t, watcher_queue);
    uv__queue_remove(q);
    uv__queue_init(q);

    op = EPOLL_CTL_MOD;
    if (w->events == 0)
      op = EPOLL_CTL_ADD;

    w->events = w->pevents;
    e.events = w->pevents;
    e.data.fd = w->fd;
    fd = w->fd;

    if (ctl->ringfd != -1) {
      uv__epoll_ctl_prep(epollfd, ctl, &prep, op, fd, &e);
      continue;
    }

    if (!epoll_ctl(epollfd, op, fd, &e))
      continue;

    assert(op == EPOLL_CTL_ADD);
    assert(errno == EEXIST);

    /* File descriptor that's been watched before, update event mask. */
    if (epoll_ctl(epollfd, EPOLL_CTL_MOD, fd, &e))
      abort();
  }

  inv.events = events;
  inv.prep = &prep;
  inv.nfds = -1;

  for (;;) {
    if (loop->nfds == 0)
      if (iou->in_flight == 0)
        break;

    /* All event mask mutations should be visible to the kernel before
     * we enter epoll_pwait().
     */
    if (ctl->ringfd != -1)
      while (*ctl->sqhead != *ctl->sqtail)
        uv__epoll_ctl_flush(epollfd, ctl, &prep);

    /* Only need to set the provider_entry_time if timeout != 0. The function
     * will return early if the loop isn't configured with UV_METRICS_IDLE_TIME.
     */
    if (timeout != 0)
      uv__metrics_set_provider_entry_time(loop);

    /* Store the current timeout in a location that's globally accessible so
     * other locations like uv__work_done() can determine whether the queue
     * of events in the callback were waiting when poll was called.
     */
    lfields->current_timeout = timeout;

    nfds = epoll_pwait(epollfd, events, ARRAY_SIZE(events), timeout, sigmask);

    /* Update loop->time unconditionally. It's tempting to skip the update when
     * timeout == 0 (i.e. non-blocking poll) but there is no guarantee that the
     * operating system didn't reschedule our process while in the syscall.
     */
    SAVE_ERRNO(uv__update_time(loop));

    if (nfds == -1)
      assert(errno == EINTR);
    else if (nfds == 0)
      /* Unlimited timeout should only return with events or signal. */
      assert(timeout != -1);

    if (nfds == 0 || nfds == -1) {
      if (reset_timeout != 0) {
        timeout = user_timeout;
        reset_timeout = 0;
      } else if (nfds == 0) {
        return;
      }

      /* Interrupted by a signal. Update timeout and poll again. */
      goto update_timeout;
    }

    have_iou_events = 0;
    have_signals = 0;
    nevents = 0;

    inv.nfds = nfds;
    lfields->inv = &inv;

    for (i = 0; i < nfds; i++) {
      pe = events + i;
      fd = pe->data.fd;

      /* Skip invalidated events, see uv__platform_invalidate_fd */
      if (fd == -1)
        continue;

      if (fd == iou->ringfd) {
        uv__poll_io_uring(loop, iou);
        have_iou_events = 1;
        continue;
      }

      assert(fd >= 0);
      assert((unsigned) fd < loop->nwatchers);

      w = loop->watchers[fd];

      if (w == NULL) {
        /* File descriptor that we've stopped watching, disarm it.
         *
         * Ignore all errors because we may be racing with another thread
         * when the file descriptor is closed.
         *
         * Perform EPOLL_CTL_DEL immediately instead of going through
         * io_uring's submit queue, otherwise the file descriptor may
         * be closed by the time the kernel starts the operation.
         */
        epoll_ctl(epollfd, EPOLL_CTL_DEL, fd, pe);
        continue;
      }

      /* Give users only events they're interested in. Prevents spurious
       * callbacks when previous callback invocation in this loop has stopped
       * the current watcher. Also, filters out events that users has not
       * requested us to watch.
       */
      pe->events &= w->pevents | POLLERR | POLLHUP;

      /* Work around an epoll quirk where it sometimes reports just the
       * EPOLLERR or EPOLLHUP event.  In order to force the event loop to
       * move forward, we merge in the read/write events that the watcher
       * is interested in; uv__read() and uv__write() will then deal with
       * the error or hangup in the usual fashion.
       *
       * Note to self: happens when epoll reports EPOLLIN|EPOLLHUP, the user
       * reads the available data, calls uv_read_stop(), then sometime later
       * calls uv_read_start() again.  By then, libuv has forgotten about the
       * hangup and the kernel won't report EPOLLIN again because there's
       * nothing left to read.  If anything, libuv is to blame here.  The
       * current hack is just a quick bandaid; to properly fix it, libuv
       * needs to remember the error/hangup event.  We should get that for
       * free when we switch over to edge-triggered I/O.
       */
      if (pe->events == POLLERR || pe->events == POLLHUP)
        pe->events |=
          w->pevents & (POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI);

      if (pe->events != 0) {
        /* Run signal watchers last.  This also affects child process watchers
         * because those are implemented in terms of signal watchers.
         */
        if (w == &loop->signal_io_watcher) {
          have_signals = 1;
        } else {
          uv__metrics_update_idle_time(loop);
          w->cb(loop, w, pe->events);
        }

        nevents++;
      }
    }

    uv__metrics_inc_events(loop, nevents);
    if (reset_timeout != 0) {
      timeout = user_timeout;
      reset_timeout = 0;
      uv__metrics_inc_events_waiting(loop, nevents);
    }

    if (have_signals != 0) {
      uv__metrics_update_idle_time(loop);
      loop->signal_io_watcher.cb(loop, &loop->signal_io_watcher, POLLIN);
    }

    lfields->inv = NULL;

    if (have_iou_events != 0)
      break;  /* Event loop should cycle now so don't poll again. */

    if (have_signals != 0)
      break;  /* Event loop should cycle now so don't poll again. */

    if (nevents != 0) {
      if (nfds == ARRAY_SIZE(events) && --count != 0) {
        /* Poll for more events but don't block this time. */
        timeout = 0;
        continue;
      }
      break;
    }

update_timeout:
    if (timeout == 0)
      break;

    if (timeout == -1)
      continue;

    assert(timeout > 0);

    real_timeout -= (loop->time - base);
    if (real_timeout <= 0)
      break;

    timeout = real_timeout;
  }

  if (ctl->ringfd != -1)
    while (*ctl->sqhead != *ctl->sqtail)
      uv__epoll_ctl_flush(epollfd, ctl, &prep);
}